

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZKrylovEigenSolver.cpp
# Opt level: O3

void __thiscall TPZKrylovEigenSolver<float>::AdjustTargetST(TPZKrylovEigenSolver<float> *this)

{
  long lVar1;
  TPZAutoPointer<TPZSpectralTransform<float>_> local_18;
  
  local_18.fRef = (this->fST).fRef;
  LOCK();
  ((local_18.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_18.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if ((local_18.fRef)->fPointer == (TPZSpectralTransform<float> *)0x0) {
    TPZAutoPointer<TPZSpectralTransform<float>_>::~TPZAutoPointer(&local_18);
  }
  else {
    lVar1 = __dynamic_cast((local_18.fRef)->fPointer,&TPZSpectralTransform<float>::typeinfo,
                           &TPZSTShiftOrigin<float>::typeinfo,0);
    TPZAutoPointer<TPZSpectralTransform<float>_>::~TPZAutoPointer(&local_18);
    if (lVar1 != 0) {
      *(float *)(lVar1 + 8) = (this->super_TPZEigenSolver<float>).fTarget;
    }
  }
  return;
}

Assistant:

void TPZKrylovEigenSolver<TVar>::AdjustTargetST()
{
  auto st =
    dynamic_cast<TPZSTShiftOrigin<TVar>*>(this->SpectralTransform().operator->());
  if(st){
    st->SetShift(this->Target());
  }
}